

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  msg_wrap_t<msg_out> *this;
  msg_wrap_t<msg_start> *this_00;
  int *piVar4;
  int __how;
  timespec *ptVar5;
  acto *paVar6;
  long lVar7;
  actor_ref wall;
  actor_ref console;
  timespec local_50;
  actor_ref local_40;
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Balls    : ",0xb);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Duration : ",0xb);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,2000);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Players  : ",0xb);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,10000);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  lVar7 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- ",4);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," : start acto ---",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    acto::spawn<Console>((acto *)&local_38,bind);
    acto::spawn<Wall>();
    if (local_38 != 0) {
      this = (msg_wrap_t<msg_out> *)operator_new(0x40);
      acto::core::msg_wrap_t<msg_out>::msg_wrap_t<char_const(&)[11]>
                (this,(char (*) [11])"send start");
      local_50.tv_sec = (__time_t)this;
      acto::actor_ref::send_message
                ((actor_ref *)&local_38,
                 (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&local_50
                );
      if ((msg_wrap_t<msg_out> *)local_50.tv_sec != (msg_wrap_t<msg_out> *)0x0) {
        (*((msg_t *)local_50.tv_sec)->_vptr_msg_t[1])();
      }
      local_50.tv_sec = 0;
    }
    if (local_40.object_ != (object_t *)0x0) {
      this_00 = (msg_wrap_t<msg_start> *)operator_new(0x30);
      acto::core::msg_wrap_t<msg_start>::msg_wrap_t<int_const&,acto::actor_ref&>
                (this_00,&BALLS,(actor_ref *)&local_38);
      local_50.tv_sec = (__time_t)this_00;
      acto::actor_ref::send_message
                (&local_40,
                 (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&local_50
                );
      if ((msg_wrap_t<msg_start> *)local_50.tv_sec != (msg_wrap_t<msg_start> *)0x0) {
        (*((msg_t *)local_50.tv_sec)->_vptr_msg_t[1])();
      }
    }
    local_50.tv_sec = 2;
    local_50.tv_nsec = 0;
    do {
      iVar1 = nanosleep(&local_50,&local_50);
      if (iVar1 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (local_40.object_ != (object_t *)0x0) {
      local_50.tv_sec = (__time_t)operator_new(0x28);
      *(long *)(local_50.tv_sec + 8) = 0;
      *(pointer_____offset_0x10___ **)(local_50.tv_sec + 0x10) = &msg_finish::typeinfo;
      *(long *)(local_50.tv_sec + 0x18) = 0;
      *(undefined ***)local_50.tv_sec = &PTR__msg_t_0010ec08;
      acto::actor_ref::send_message
                (&local_40,
                 (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&local_50
                );
      if ((long *)local_50.tv_sec != (long *)0x0) {
        (**(code **)(*(long *)local_50.tv_sec + 8))();
      }
      local_50.tv_sec = 0;
    }
    acto::join(&local_40);
    acto::this_thread::process_messages();
    acto::actor_ref::~actor_ref(&local_40);
    local_50.tv_sec = 1;
    local_50.tv_nsec = 0;
    do {
      ptVar5 = &local_50;
      iVar1 = nanosleep(&local_50,&local_50);
      __how = (int)ptVar5;
      if (iVar1 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    paVar6 = (acto *)&local_38;
    acto::actor_ref::~actor_ref((actor_ref *)&local_38);
    acto::shutdown((int)paVar6,__how);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- end acto ---",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": end",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
  std::cout << "Balls    : " << BALLS    << std::endl;
  std::cout << "Duration : " << DURATION << std::endl;
  std::cout << "Players  : " << PLAYERS  << std::endl;
  std::cout << std::endl;

  for (unsigned int i = 1; i < 4; i++) {
    std::cout << "--- " << i << " : start acto ---" << std::endl;
    {
      // Создать консоль.
      // Все актеры должны создаваться с использованием шаблона act_o::spawn<>.
      // Использование оператора new недопустимо.
      acto::actor_ref console = acto::spawn< Console >(acto::actor_thread::bind);

      for(unsigned int j = 0; j < 1; j++) {
        // Создать стену.
        // Опция "acto::aoExclusive" создает для объекта отдельный поток,
        // в котором будут выполнятся все обработчики этого объекта
        acto::actor_ref wall = acto::spawn< Wall >();

        // -
        console.send< msg_out >("send start");

        // Начать игру: инициализировать объект, запустить мячи
        wall.send< msg_start >(BALLS, console);

        // Игра продолжается некоторое время в независимых потоках
        acto::this_thread::sleep_for(std::chrono::milliseconds(DURATION));

        // Остановить игру
        wall.send(msg_finish());

        // Дождаться завершения выполнения
        acto::join(wall);

        // Обработать сообщения для консоли
        acto::this_thread::process_messages();
      }
      acto::this_thread::sleep_for(std::chrono::milliseconds(1000));
    }
    // По зовершении работы библиотеки необходимо вызвать эту функцию,
    // чтобы освободить все занимаемые ресурсы.
    acto::shutdown();
    // -
    std::cout << "--- end acto ---" << std::endl;
  }

  // Выполнение программы закончено
  std::cout << ": end" << std::endl;
#ifdef ACTO_WIN
  _getch();
#endif
  // -
  return 0;
}